

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  char *pcVar1;
  uint *puVar2;
  byte bVar3;
  element_type *peVar4;
  char cVar5;
  type_error *ptVar6;
  long *plVar7;
  size_type *psVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  uint uVar12;
  ulong unaff_R13;
  unsigned_long __val;
  bool bVar13;
  stringstream local_270 [8];
  stringstream ss;
  long local_260 [2];
  undefined8 uStack_250;
  uint auStack_248 [50];
  char acStack_180 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_48;
  array<char,_512UL> *local_40;
  uint local_38;
  byte local_31;
  
  uVar9 = CONCAT71(in_register_00000011,ensure_ascii);
  if (s->_M_string_length == 0) {
    bVar13 = true;
    lVar11 = 0;
  }
  else {
    local_40 = &this->string_buffer;
    local_38 = (uint)uVar9;
    local_31 = !ensure_ascii;
    lVar11 = 0;
    __val = 0;
    bVar10 = 0;
    local_48 = this;
    do {
      bVar3 = (s->_M_dataplus)._M_p[__val];
      if (bVar10 == 0) {
        uVar12 = 0xffU >> (serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                           ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar3] & 0x1f
                          ) & (uint)bVar3;
      }
      else {
        uVar12 = (int)unaff_R13 << 6 | bVar3 & 0x3f;
      }
      unaff_R13 = (ulong)uVar12;
      bVar10 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d
               [(ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                             ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar3] +
                (ulong)bVar10 * 0x10 + 0x100];
      if (bVar10 == 0) {
        switch(uVar12) {
        case 8:
          pcVar1 = (this->string_buffer)._M_elems + lVar11;
          pcVar1[0] = '\\';
          pcVar1[1] = 'b';
          break;
        case 9:
          pcVar1 = (this->string_buffer)._M_elems + lVar11;
          pcVar1[0] = '\\';
          pcVar1[1] = 't';
          break;
        case 10:
          pcVar1 = (this->string_buffer)._M_elems + lVar11;
          pcVar1[0] = '\\';
          pcVar1[1] = 'n';
          break;
        case 0xb:
switchD_00121b43_caseD_b:
          if ((0x1f < uVar12 & (uVar12 < 0x7f | local_31)) == 0) {
            if (uVar12 < 0x10000) {
              snprintf(local_40->_M_elems + lVar11,7,"\\u%04x",unaff_R13);
              lVar11 = lVar11 + 6;
            }
            else {
              snprintf(local_40->_M_elems + lVar11,0xd,"\\u%04x\\u%04x",
                       (ulong)((uVar12 >> 10) + 0xd7c0 & 0xffff),(ulong)(uVar12 & 0x3ff | 0xdc00));
              lVar11 = lVar11 + 0xc;
            }
            uVar9 = (ulong)local_38;
            this = local_48;
          }
          else {
            (this->string_buffer)._M_elems[lVar11] = bVar3;
            lVar11 = lVar11 + 1;
          }
          goto LAB_00121bf3;
        case 0xc:
          pcVar1 = (this->string_buffer)._M_elems + lVar11;
          pcVar1[0] = '\\';
          pcVar1[1] = 'f';
          break;
        case 0xd:
          pcVar1 = (this->string_buffer)._M_elems + lVar11;
          pcVar1[0] = '\\';
          pcVar1[1] = 'r';
          break;
        default:
          if (uVar12 == 0x22) {
            pcVar1 = (this->string_buffer)._M_elems + lVar11;
            pcVar1[0] = '\\';
            pcVar1[1] = '\"';
          }
          else {
            if (uVar12 != 0x5c) goto switchD_00121b43_caseD_b;
            pcVar1 = (this->string_buffer)._M_elems + lVar11;
            pcVar1[0] = '\\';
            pcVar1[1] = '\\';
          }
        }
        lVar11 = lVar11 + 2;
LAB_00121bf3:
        if (lVar11 - 500U < 0xd) {
          peVar4 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,local_40,lVar11);
          uVar9 = (ulong)local_38;
          lVar11 = 0;
          this = local_48;
        }
      }
      else {
        if (bVar10 == 1) {
          std::__cxx11::stringstream::stringstream(local_270);
          *(undefined8 *)((long)&uStack_250 + *(long *)(local_260[0] + -0x18)) = 2;
          puVar2 = (uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18));
          *puVar2 = *puVar2 | 0x4000;
          lVar11 = *(long *)(local_260[0] + -0x18);
          if (acStack_180[lVar11 + 1] == '\0') {
            cVar5 = std::ios::widen((char)local_260 + (char)lVar11);
            acStack_180[lVar11] = cVar5;
            acStack_180[lVar11 + 1] = '\x01';
          }
          acStack_180[lVar11] = '0';
          *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) =
               *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) & 0xffffffb5 | 8;
          std::ostream::operator<<(local_260,(uint)bVar3);
          ptVar6 = (type_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::to_string(&local_c8,__val);
          std::operator+(&local_e8,"invalid UTF-8 byte at index ",&local_c8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_68._M_dataplus._M_p = (pointer)*plVar7;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_68._M_dataplus._M_p == psVar8) {
            local_68.field_2._M_allocated_capacity = *psVar8;
            local_68.field_2._8_8_ = plVar7[3];
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          }
          else {
            local_68.field_2._M_allocated_capacity = *psVar8;
          }
          local_68._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::stringbuf::str();
          std::operator+(&local_88,&local_68,&local_a8);
          type_error::create(ptVar6,0x13c,&local_88);
          __cxa_throw(ptVar6,&type_error::typeinfo,exception::~exception);
        }
        if ((char)uVar9 == '\0') {
          (this->string_buffer)._M_elems[lVar11] = bVar3;
          lVar11 = lVar11 + 1;
        }
      }
      __val = __val + 1;
    } while (__val < s->_M_string_length);
    bVar13 = bVar10 == 0;
  }
  if (!bVar13) {
    std::__cxx11::stringstream::stringstream(local_270);
    *(undefined8 *)((long)&uStack_250 + *(long *)(local_260[0] + -0x18)) = 2;
    puVar2 = (uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18));
    *puVar2 = *puVar2 | 0x4000;
    lVar11 = *(long *)(local_260[0] + -0x18);
    if (acStack_180[lVar11 + 1] == '\0') {
      cVar5 = std::ios::widen((char)local_260 + (char)lVar11);
      acStack_180[lVar11] = cVar5;
      acStack_180[lVar11 + 1] = '\x01';
    }
    acStack_180[lVar11] = '0';
    *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) =
         *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<(local_260,(uint)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
    ptVar6 = (type_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_88,"incomplete UTF-8 string; last byte: 0x",&local_68);
    type_error::create(ptVar6,0x13c,&local_88);
    __cxa_throw(ptVar6,&type_error::typeinfo,exception::~exception);
  }
  if (lVar11 == 0) {
    return;
  }
  peVar4 = (this->o).
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,&this->string_buffer,lVar11);
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
                                                  static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    std::stringstream ss;
                    ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
                    JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    break;
                }
            }
        }

        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            std::stringstream ss;
            ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(s.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
        }
    }